

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O2

value_ptr pstore::dump::details::default_make_value<unsigned_short_const&>(unsigned_short *t)

{
  value_ptr vVar1;
  
  vVar1 = dump::make_value(t);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)t;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline value_ptr default_make_value (T const & t) {
                return make_value (t);
            }